

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

iterator * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::end
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this)

{
  iterator *in_RDI;
  iterator *it;
  
  iterator::iterator(in_RDI,(IntervalMap<unsigned_long,_std::monostate,_0U> *)in_RDI);
  const_iterator::setToEnd((const_iterator *)0x87cbd3);
  return in_RDI;
}

Assistant:

iterator end() {
        iterator it(*this);
        it.setToEnd();
        return it;
    }